

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_nonfinite<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  ulong uVar1;
  uint uVar2;
  size_type sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar6 = (ulong)specs->width;
  if (-1 < (long)uVar6) {
    uVar2 = *(uint *)&fspecs->field_0x4;
    uVar5 = uVar2 >> 8 & 0xff;
    uVar1 = (ulong)(uVar5 != 0) + 3;
    uVar9 = 0;
    if (uVar1 <= uVar6) {
      uVar9 = uVar6 - uVar1;
    }
    uVar6 = uVar9 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = (out.container)->_M_string_length;
    std::__cxx11::string::resize
              ((ulong)out.container,
               (char)sVar3 + (uVar5 != 0) + '\x03' + (specs->fill).size_ * (char)uVar9);
    pcVar4 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar3,uVar6,&specs->fill);
    if (uVar5 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar5);
      pcVar4 = pcVar4 + 1;
    }
    bVar10 = (uVar2 >> 0x10 & 1) == 0;
    pcVar7 = "INF";
    if (bVar10) {
      pcVar7 = "inf";
    }
    pcVar8 = "NAN";
    if (bVar10) {
      pcVar8 = "nan";
    }
    if (isinf) {
      pcVar8 = pcVar7;
    }
    pcVar4[2] = pcVar8[2];
    *(undefined2 *)pcVar4 = *(undefined2 *)pcVar8;
    fill<char*,char>(pcVar4 + 3,uVar9 - uVar6,&specs->fill);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
              ,0x13c,"negative value");
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}